

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O3

void __thiscall libtorrent::settings_pack::clear(settings_pack *this,int name)

{
  pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppVar4;
  pointer ppVar5;
  pointer ppVar6;
  pointer ppVar7;
  iterator __position;
  int *piVar8;
  bool *pbVar9;
  difference_type __d;
  ulong uVar10;
  long lVar11;
  ushort uVar12;
  ulong uVar13;
  ulong uVar14;
  
  uVar12 = (ushort)name;
  switch((uint)name >> 0xe & 3) {
  case 0:
    __position._M_current =
         (this->m_strings).
         super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    ppVar1 = (this->m_strings).
             super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar14 = (long)ppVar1 - (long)__position._M_current;
    if (0 < (long)uVar14) {
      uVar14 = (uVar14 >> 3) * -0x3333333333333333;
      do {
        uVar10 = uVar14 >> 1;
        uVar13 = uVar10;
        if (__position._M_current[uVar10].first < uVar12) {
          uVar13 = ~uVar10 + uVar14;
          __position._M_current = __position._M_current + uVar10 + 1;
        }
        uVar14 = uVar13;
      } while (0 < (long)uVar13);
    }
    if ((__position._M_current != ppVar1) && ((uint)(__position._M_current)->first == name)) {
      ::std::
      vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_M_erase(&this->m_strings,__position);
    }
    break;
  case 1:
    ppVar2 = (this->m_ints).
             super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar3 = (this->m_ints).
             super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar14 = (long)ppVar3 - (long)ppVar2 >> 3;
    while (ppVar7 = ppVar2, 0 < (long)uVar14) {
      uVar13 = uVar14 >> 1;
      uVar14 = ~uVar13 + uVar14;
      ppVar2 = ppVar7 + uVar13 + 1;
      if (uVar12 <= ppVar7[uVar13].first) {
        ppVar2 = ppVar7;
        uVar14 = uVar13;
      }
    }
    if ((ppVar7 != ppVar3) && ((uint)ppVar7->first == name)) {
      if ((ppVar7 + 1 != ppVar3) && (lVar11 = (long)ppVar3 - (long)(ppVar7 + 1) >> 3, 0 < lVar11)) {
        uVar14 = lVar11 + 1;
        piVar8 = &ppVar7[1].second;
        do {
          *(unsigned_short *)(piVar8 + -3) = ((pair<unsigned_short,_int> *)(piVar8 + -1))->first;
          piVar8[-2] = *piVar8;
          uVar14 = uVar14 - 1;
          piVar8 = piVar8 + 2;
        } while (1 < uVar14);
      }
      (this->m_ints).
      super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar3 + -1;
    }
    break;
  case 2:
    ppVar4 = (this->m_bools).
             super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar5 = (this->m_bools).
             super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar14 = (long)ppVar5 - (long)ppVar4 >> 2;
    while (ppVar6 = ppVar4, 0 < (long)uVar14) {
      uVar13 = uVar14 >> 1;
      uVar14 = ~uVar13 + uVar14;
      ppVar4 = ppVar6 + uVar13 + 1;
      if (uVar12 <= ppVar6[uVar13].first) {
        ppVar4 = ppVar6;
        uVar14 = uVar13;
      }
    }
    if ((ppVar6 != ppVar5) && ((uint)ppVar6->first == name)) {
      if ((ppVar6 + 1 != ppVar5) && (lVar11 = (long)ppVar5 - (long)(ppVar6 + 1) >> 2, 0 < lVar11)) {
        uVar14 = lVar11 + 1;
        pbVar9 = &ppVar6[1].second;
        do {
          *(unsigned_short *)(pbVar9 + -6) = ((pair<unsigned_short,_bool> *)(pbVar9 + -2))->first;
          pbVar9[-4] = *pbVar9;
          uVar14 = uVar14 - 1;
          pbVar9 = pbVar9 + 4;
        } while (1 < uVar14);
      }
      (this->m_bools).
      super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar5 + -1;
    }
  }
  return;
}

Assistant:

void settings_pack::clear(int const name)
	{
		switch (name & type_mask)
		{
			case string_type_base:
			{
				std::pair<std::uint16_t, std::string> v(aux::numeric_cast<std::uint16_t>(name), std::string());
				auto const i = std::lower_bound(m_strings.begin(), m_strings.end()
					, v, &compare_first<std::string>);
				if (i != m_strings.end() && i->first == name) m_strings.erase(i);
				break;
			}
			case int_type_base:
			{
				std::pair<std::uint16_t, int> v(aux::numeric_cast<std::uint16_t>(name), 0);
				auto const i = std::lower_bound(m_ints.begin(), m_ints.end()
					, v, &compare_first<int>);
				if (i != m_ints.end() && i->first == name) m_ints.erase(i);
				break;
			}
			case bool_type_base:
			{
				std::pair<std::uint16_t, bool> v(aux::numeric_cast<std::uint16_t>(name), false);
				auto const i = std::lower_bound(m_bools.begin(), m_bools.end()
					, v, &compare_first<bool>);
				if (i != m_bools.end() && i->first == name) m_bools.erase(i);
				break;
			}
		}
	}